

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemExpandBlob(Mem *pMem)

{
  int iVar1;
  int *in_RDI;
  int nByte;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  iVar1 = in_RDI[4] + *in_RDI;
  if (iVar1 < 1) {
    if ((*(ushort *)(in_RDI + 5) & 0x10) == 0) {
      return 0;
    }
    iVar1 = 1;
  }
  iVar1 = sqlite3VdbeMemGrow((Mem *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),0,0x13de61);
  if (iVar1 == 0) {
    memset((void *)(*(long *)(in_RDI + 2) + (long)in_RDI[4]),0,(long)*in_RDI);
    in_RDI[4] = *in_RDI + in_RDI[4];
    *(ushort *)(in_RDI + 5) = *(ushort *)(in_RDI + 5) & 63999;
    local_4 = 0;
  }
  else {
    local_4 = 7;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemExpandBlob(Mem *pMem){
  int nByte;
  assert( pMem!=0 );
  assert( pMem->flags & MEM_Zero );
  assert( (pMem->flags&MEM_Blob)!=0 || MemNullNochng(pMem) );
  testcase( sqlite3_value_nochange(pMem) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );

  /* Set nByte to the number of bytes required to store the expanded blob. */
  nByte = pMem->n + pMem->u.nZero;
  if( nByte<=0 ){
    if( (pMem->flags & MEM_Blob)==0 ) return SQLITE_OK;
    nByte = 1;
  }
  if( sqlite3VdbeMemGrow(pMem, nByte, 1) ){
    return SQLITE_NOMEM_BKPT;
  }
  assert( pMem->z!=0 );
  assert( sqlite3DbMallocSize(pMem->db,pMem->z) >= nByte );

  memset(&pMem->z[pMem->n], 0, pMem->u.nZero);
  pMem->n += pMem->u.nZero;
  pMem->flags &= ~(MEM_Zero|MEM_Term);
  return SQLITE_OK;
}